

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

bool __thiscall QHttpMultiPartIODevice::isSequential(QHttpMultiPartIODevice *this)

{
  ulong uVar1;
  QIODevice *pQVar2;
  char cVar3;
  int a;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    uVar1 = (this->multiPart->parts).d.size;
    if (uVar1 <= uVar4) break;
    pQVar2 = ((this->multiPart->parts).d.ptr[uVar4].d.d.ptr)->bodyDevice;
    if (pQVar2 != (QIODevice *)0x0) {
      cVar3 = (**(code **)(*(long *)pQVar2 + 0x60))();
      if (cVar3 != '\0') break;
    }
    uVar4 = uVar4 + 1;
  }
  return uVar4 < uVar1;
}

Assistant:

bool QHttpMultiPartIODevice::isSequential() const
{
    for (int a = 0; a < multiPart->parts.size(); a++) {
        QIODevice *device = multiPart->parts.at(a).d->bodyDevice;
        // we are sequential if any of the bodyDevices of our parts are sequential;
        // when reading from a byte array, we are not sequential
        if (device && device->isSequential())
            return true;
    }
    return false;
}